

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder_context.h
# Opt level: O2

void __thiscall
mocker::ir::BuilderContext::
emplaceInst<mocker::ir::Call,std::shared_ptr<mocker::ir::Reg>&,char_const(&)[12],std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Addr>>
          (BuilderContext *this,shared_ptr<mocker::ir::Reg> *args,char (*args_1) [12],
          shared_ptr<mocker::ir::Addr> *args_2,shared_ptr<mocker::ir::Addr> *args_3)

{
  shared_ptr<mocker::ir::Call> inst;
  shared_ptr<mocker::ir::IRInst> local_38;
  shared_ptr<mocker::ir::Reg> local_28;
  
  std::
  make_shared<mocker::ir::Call,std::shared_ptr<mocker::ir::Reg>&,char_const(&)[12],std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Addr>>
            (&local_28,(char (*) [12])args,(shared_ptr<mocker::ir::Addr> *)args_1,args_2);
  local_38.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_28.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_38.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_28.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  local_28.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_28.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  appendInst(this,&local_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_38.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_28.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void emplaceInst(Args &&... args) {
    auto inst = std::make_shared<InstType>(std::forward<Args>(args)...);
    appendInst(std::move(inst));
  }